

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O0

int Precond(sunrealtype t,N_Vector c,N_Vector fc,int jok,int *jcurPtr,sunrealtype gamma,
           void *user_data)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  sunrealtype *cdotdata;
  sunrealtype t_00;
  undefined4 *in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  WebData in_R8;
  double dVar12;
  double in_XMM1_Qa;
  N_Vector rewt;
  WebData wdata;
  sunrealtype *rewtdata;
  sunrealtype *cdata;
  sunrealtype *fsave;
  sunrealtype *f1;
  sunrealtype srur;
  sunrealtype save;
  sunrealtype r0;
  sunrealtype r;
  sunrealtype fac;
  sunrealtype uround;
  sunindextype denseretval;
  int retval;
  int mp;
  int mxmp;
  int ngy;
  int ngx;
  int ngrp;
  int *jyr;
  int *jxr;
  int jy;
  int jx;
  int jj;
  int j;
  int igy;
  int igx;
  int ig;
  int if00;
  int if0;
  int i;
  sunindextype **pivot;
  sunrealtype ***P;
  int in_stack_fffffffffffffeec;
  char *in_stack_fffffffffffffef0;
  N_Vector returnvalue;
  WebData wdata_00;
  sunrealtype *cdata_00;
  double local_c8;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_54;
  int local_4;
  
  returnvalue = in_R8->rewt;
  CVodeGetErrWeights(in_R8->cvode_mem,returnvalue);
  iVar8 = check_retval(returnvalue,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  if (iVar8 == 0) {
    lVar11 = N_VGetArrayPointer(in_RDI);
    cdotdata = (sunrealtype *)N_VGetArrayPointer(returnvalue);
    iVar8 = in_R8->mp;
    dVar1 = in_R8->srur;
    iVar3 = in_R8->ngrp;
    iVar4 = in_R8->ngx;
    iVar5 = in_R8->ngy;
    iVar6 = in_R8->mxmp;
    cdata_00 = in_R8->fsave;
    wdata_00 = in_R8;
    t_00 = (sunrealtype)N_VGetArrayPointer(in_R8->vtemp);
    local_c8 = (double)N_VWrmsNorm(in_RSI,returnvalue);
    local_c8 = ABS(in_XMM1_Qa) * 1000.0 * 2.220446049250313e-16 * 2401.0 * local_c8;
    if ((local_c8 == 0.0) && (!NAN(local_c8))) {
      local_c8 = 1.0;
    }
    for (local_68 = 0; local_68 < iVar5; local_68 = local_68 + 1) {
      iVar7 = in_R8->jyr[local_68];
      for (local_64 = 0; local_64 < iVar4; local_64 = local_64 + 1) {
        iVar9 = iVar7 * iVar6 + in_R8->jxr[local_64] * iVar8;
        for (local_6c = 0; local_6c < iVar8; local_6c = local_6c + 1) {
          iVar10 = iVar9 + local_6c;
          dVar2 = *(double *)(lVar11 + (long)iVar10 * 8);
          if (dVar1 * ABS(dVar2) <= local_c8 / cdotdata[iVar10]) {
            dVar12 = local_c8 / cdotdata[iVar10];
          }
          else {
            dVar12 = dVar1 * ABS(dVar2);
          }
          *(double *)(lVar11 + (long)iVar10 * 8) = dVar12 + *(double *)(lVar11 + (long)iVar10 * 8);
          fblock(t_00,cdata_00,(int)((ulong)lVar11 >> 0x20),(int)lVar11,cdotdata,wdata_00);
          for (local_54 = 0; local_54 < iVar8; local_54 = local_54 + 1) {
            in_R8->P[local_64 + local_68 * iVar4][local_6c][local_54] =
                 (*(double *)((long)t_00 + (long)local_54 * 8) - cdata_00[iVar9 + local_54]) *
                 (-in_XMM1_Qa / dVar12);
          }
          *(double *)(lVar11 + (long)iVar10 * 8) = dVar2;
        }
      }
    }
    for (local_60 = 0; local_60 < iVar3; local_60 = local_60 + 1) {
      SUNDlsMat_denseAddIdentity(in_R8->P[local_60],(long)iVar8);
      lVar11 = SUNDlsMat_denseGETRF
                         (in_R8->P[local_60],(long)iVar8,(long)iVar8,in_R8->pivot[local_60]);
      if (lVar11 != 0) {
        return 1;
      }
    }
    *in_RCX = 1;
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int Precond(sunrealtype t, N_Vector c, N_Vector fc, sunbooleantype jok,
                   sunbooleantype* jcurPtr, sunrealtype gamma, void* user_data)
{
  sunrealtype*** P;
  sunindextype** pivot;
  int i, if0, if00, ig, igx, igy, j, jj, jx, jy;
  int *jxr, *jyr, ngrp, ngx, ngy, mxmp, mp, retval;
  sunindextype denseretval;
  sunrealtype uround, fac, r, r0, save, srur;
  sunrealtype *f1, *fsave, *cdata, *rewtdata;
  WebData wdata;
  N_Vector rewt;

  wdata  = (WebData)user_data;
  rewt   = wdata->rewt;
  retval = CVodeGetErrWeights(wdata->cvode_mem, rewt);
  if (check_retval(&retval, "CVodeGetErrWeights", 1)) { return (1); }

  cdata    = N_VGetArrayPointer(c);
  rewtdata = N_VGetArrayPointer(rewt);

  uround = SUN_UNIT_ROUNDOFF;

  P     = wdata->P;
  pivot = wdata->pivot;
  jxr   = wdata->jxr;
  jyr   = wdata->jyr;
  mp    = wdata->mp;
  srur  = wdata->srur;
  ngrp  = wdata->ngrp;
  ngx   = wdata->ngx;
  ngy   = wdata->ngy;
  mxmp  = wdata->mxmp;
  fsave = wdata->fsave;

  /* Make mp calls to fblock to approximate each diagonal block of Jacobian.
     Here, fsave contains the base value of the rate vector and
     r0 is a minimum increment factor for the difference quotient. */

  f1 = N_VGetArrayPointer(wdata->vtemp);

  fac = N_VWrmsNorm(fc, rewt);
  r0  = SUN_RCONST(1000.0) * SUNRabs(gamma) * uround * (NEQ + 1) * fac;
  if (r0 == ZERO) { r0 = ONE; }

  for (igy = 0; igy < ngy; igy++)
  {
    jy   = jyr[igy];
    if00 = jy * mxmp;
    for (igx = 0; igx < ngx; igx++)
    {
      jx  = jxr[igx];
      if0 = if00 + jx * mp;
      ig  = igx + igy * ngx;
      /* Generate ig-th diagonal block */
      for (j = 0; j < mp; j++)
      {
        /* Generate the jth column as a difference quotient */
        jj   = if0 + j;
        save = cdata[jj];
        r    = MAX(srur * SUNRabs(save), r0 / rewtdata[jj]);
        cdata[jj] += r;
        fac = -gamma / r;
        fblock(t, cdata, jx, jy, f1, wdata);
        for (i = 0; i < mp; i++)
        {
          P[ig][j][i] = (f1[i] - fsave[if0 + i]) * fac;
        }
        cdata[jj] = save;
      }
    }
  }

  /* Add identity matrix and do LU decompositions on blocks. */

  for (ig = 0; ig < ngrp; ig++)
  {
    SUNDlsMat_denseAddIdentity(P[ig], mp);
    denseretval = SUNDlsMat_denseGETRF(P[ig], mp, mp, pivot[ig]);
    if (denseretval != 0) { return (1); }
  }

  *jcurPtr = SUNTRUE;
  return (0);
}